

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

__pid_t __thiscall acto::core::event::wait(event *this,void *__stat_loc)

{
  cv_status cVar1;
  long lVar2;
  __pid_t _Var3;
  unique_lock<std::mutex> g;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  unique_lock<std::mutex> local_40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  local_30.__d.__r = (duration)(lVar2 + (long)__stat_loc);
  local_40._M_owns = false;
  local_40._M_device = &this->mutex_;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  do {
    if (this->triggered_ != false) goto LAB_001085a4;
    cVar1 = std::condition_variable::
            __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      (&this->cond_,&local_40,&local_30);
  } while (cVar1 != timeout);
  _Var3 = 2;
  if (this->triggered_ != false) {
LAB_001085a4:
    this->triggered_ = (bool)(this->auto_ ^ 1);
    _Var3 = 1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return _Var3;
}

Assistant:

wait_result event::wait(const std::chrono::nanoseconds duration) {
  const auto deadline = std::chrono::high_resolution_clock::now() + duration;
  std::unique_lock g(mutex_);

  if (!cond_.wait_until(g, deadline, [this] { return triggered_; })) {
    return wait_result::timeout;
  }

  triggered_ = !auto_;

  return wait_result::signaled;
}